

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall
xray_re::xr_scene_wallmarks::xr_scene_wallmarks(xr_scene_wallmarks *this,xr_scene *scene)

{
  allocator<char> local_19;
  xr_scene *local_18;
  xr_scene *scene_local;
  xr_scene_wallmarks *this_local;
  
  local_18 = scene;
  scene_local = (xr_scene *)this;
  xr_scene_part::xr_scene_part
            (&this->super_xr_scene_part,scene,"wallmark.part",SCENE_CHUNK_WALLMARKS);
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR__xr_scene_wallmarks_0038e108;
  this->m_flags = 1;
  this->m_width = 1.0;
  this->m_height = 1.0;
  this->m_rotate = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_shader,"effects\\wallmarkblend",&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::__cxx11::string::string((string *)&this->m_texture);
  std::vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>::vector(&this->m_slots)
  ;
  return;
}

Assistant:

xr_scene_wallmarks::xr_scene_wallmarks(xr_scene& scene):
	xr_scene_part(scene, "wallmark.part", SCENE_CHUNK_WALLMARKS),
	m_flags(WM_FLAG_DRAW_WALLMARKS),
	m_width(1.f),
	m_height(1.f),
	m_rotate(0),
	m_shader("effects\\wallmarkblend") {}